

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Deserializer::ClipMemory
          (BP3Deserializer *this,string *variableName,IO *io,
          vector<char,_std::allocator<char>_> *contiguousMemory,Box<Dims> *blockBox,
          Box<Dims> *intersectionBox)

{
  DataType DVar1;
  Variable<signed_char> *pVVar2;
  Variable<char> *pVVar3;
  Variable<std::complex<float>_> *pVVar4;
  Variable<unsigned_char> *pVVar5;
  Variable<std::complex<double>_> *pVVar6;
  Variable<double> *pVVar7;
  Variable<int> *pVVar8;
  Variable<long> *pVVar9;
  Variable<unsigned_long> *pVVar10;
  Variable<short> *pVVar11;
  Variable<unsigned_short> *pVVar12;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pVVar13;
  Variable<unsigned_int> *pVVar14;
  Variable<long_double> *pVVar15;
  Variable<float> *pVVar16;
  
  DVar1 = core::IO::InquireVariableType(io,variableName);
  switch(DVar1) {
  case Int8:
    pVVar2 = core::IO::InquireVariable<signed_char>(io,variableName);
    if (pVVar2 != (Variable<signed_char> *)0x0) {
      helper::ClipContiguousMemory<signed_char>
                (pVVar2->m_Data,&(pVVar2->super_VariableBase).m_Start,
                 &(pVVar2->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case Int16:
    pVVar11 = core::IO::InquireVariable<short>(io,variableName);
    if (pVVar11 != (Variable<short> *)0x0) {
      helper::ClipContiguousMemory<short>
                (pVVar11->m_Data,&(pVVar11->super_VariableBase).m_Start,
                 &(pVVar11->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case Int32:
    pVVar8 = core::IO::InquireVariable<int>(io,variableName);
    if (pVVar8 != (Variable<int> *)0x0) {
      helper::ClipContiguousMemory<int>
                (pVVar8->m_Data,&(pVVar8->super_VariableBase).m_Start,
                 &(pVVar8->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case Int64:
    pVVar9 = core::IO::InquireVariable<long>(io,variableName);
    if (pVVar9 != (Variable<long> *)0x0) {
      helper::ClipContiguousMemory<long>
                (pVVar9->m_Data,&(pVVar9->super_VariableBase).m_Start,
                 &(pVVar9->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case UInt8:
    pVVar5 = core::IO::InquireVariable<unsigned_char>(io,variableName);
    if (pVVar5 != (Variable<unsigned_char> *)0x0) {
      helper::ClipContiguousMemory<unsigned_char>
                (pVVar5->m_Data,&(pVVar5->super_VariableBase).m_Start,
                 &(pVVar5->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case UInt16:
    pVVar12 = core::IO::InquireVariable<unsigned_short>(io,variableName);
    if (pVVar12 != (Variable<unsigned_short> *)0x0) {
      helper::ClipContiguousMemory<unsigned_short>
                (pVVar12->m_Data,&(pVVar12->super_VariableBase).m_Start,
                 &(pVVar12->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case UInt32:
    pVVar14 = core::IO::InquireVariable<unsigned_int>(io,variableName);
    if (pVVar14 != (Variable<unsigned_int> *)0x0) {
      helper::ClipContiguousMemory<unsigned_int>
                (pVVar14->m_Data,&(pVVar14->super_VariableBase).m_Start,
                 &(pVVar14->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case UInt64:
    pVVar10 = core::IO::InquireVariable<unsigned_long>(io,variableName);
    if (pVVar10 != (Variable<unsigned_long> *)0x0) {
      helper::ClipContiguousMemory<unsigned_long>
                (pVVar10->m_Data,&(pVVar10->super_VariableBase).m_Start,
                 &(pVVar10->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case Float:
    pVVar16 = core::IO::InquireVariable<float>(io,variableName);
    if (pVVar16 != (Variable<float> *)0x0) {
      helper::ClipContiguousMemory<float>
                (pVVar16->m_Data,&(pVVar16->super_VariableBase).m_Start,
                 &(pVVar16->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case Double:
    pVVar7 = core::IO::InquireVariable<double>(io,variableName);
    if (pVVar7 != (Variable<double> *)0x0) {
      helper::ClipContiguousMemory<double>
                (pVVar7->m_Data,&(pVVar7->super_VariableBase).m_Start,
                 &(pVVar7->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case LongDouble:
    pVVar15 = core::IO::InquireVariable<long_double>(io,variableName);
    if (pVVar15 != (Variable<long_double> *)0x0) {
      helper::ClipContiguousMemory<long_double>
                (pVVar15->m_Data,&(pVVar15->super_VariableBase).m_Start,
                 &(pVVar15->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case FloatComplex:
    pVVar4 = core::IO::InquireVariable<std::complex<float>>(io,variableName);
    if (pVVar4 != (Variable<std::complex<float>_> *)0x0) {
      helper::ClipContiguousMemory<std::complex<float>>
                (pVVar4->m_Data,&(pVVar4->super_VariableBase).m_Start,
                 &(pVVar4->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case DoubleComplex:
    pVVar6 = core::IO::InquireVariable<std::complex<double>>(io,variableName);
    if (pVVar6 != (Variable<std::complex<double>_> *)0x0) {
      helper::ClipContiguousMemory<std::complex<double>>
                (pVVar6->m_Data,&(pVVar6->super_VariableBase).m_Start,
                 &(pVVar6->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case String:
    pVVar13 = core::IO::InquireVariable<std::__cxx11::string>(io,variableName);
    if (pVVar13 !=
        (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      helper::ClipContiguousMemory<std::__cxx11::string>
                (pVVar13->m_Data,&(pVVar13->super_VariableBase).m_Start,
                 &(pVVar13->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
    break;
  case Char:
    pVVar3 = core::IO::InquireVariable<char>(io,variableName);
    if (pVVar3 != (Variable<char> *)0x0) {
      helper::ClipContiguousMemory<char>
                (pVVar3->m_Data,&(pVVar3->super_VariableBase).m_Start,
                 &(pVVar3->super_VariableBase).m_Count,
                 (contiguousMemory->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,blockBox,intersectionBox,
                 (bool)(&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)],
                 (bool)(&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)],false,Host);
    }
  }
  return;
}

Assistant:

void BP3Deserializer::ClipMemory(const std::string &variableName, core::IO &io,
                                 const std::vector<char> &contiguousMemory,
                                 const Box<Dims> &blockBox, const Box<Dims> &intersectionBox) const
{
    const DataType type(io.InquireVariableType(variableName));

    if (type == DataType::Struct)
    {
    }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Variable<T> *variable = io.InquireVariable<T>(variableName);                         \
        if (variable != nullptr)                                                                   \
        {                                                                                          \
            helper::ClipContiguousMemory(variable->m_Data, variable->m_Start, variable->m_Count,   \
                                         contiguousMemory, blockBox, intersectionBox,              \
                                         m_IsRowMajor, m_ReverseDimensions);                       \
        }                                                                                          \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
}